

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

void j2k_read_sot(opj_j2k_t *j2k)

{
  opj_cp_t *poVar1;
  opj_cio_t *cio;
  opj_tccp_t *poVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  uint *puVar9;
  uchar *puVar10;
  opj_tp_info_t *poVar11;
  long lVar12;
  opj_codestream_info_t *poVar13;
  opj_tile_info_t *poVar14;
  size_t __size;
  opj_tcp_t *__dest;
  ulong uVar15;
  bool bVar16;
  
  poVar1 = j2k->cp;
  cio = j2k->cio;
  cio_read(cio,2);
  uVar3 = cio_read(cio,2);
  lVar8 = (long)poVar1->tileno_size;
  if (lVar8 == 0) {
    puVar9 = (uint *)poVar1->tileno;
  }
  else {
    lVar12 = 0;
    bVar16 = false;
    while ((lVar12 < lVar8 && (!bVar16))) {
      puVar9 = (uint *)(poVar1->tileno + lVar12);
      lVar12 = lVar12 + 1;
      bVar16 = *puVar9 == uVar3;
    }
    if (bVar16) goto LAB_001dfc88;
    puVar9 = (uint *)(poVar1->tileno + lVar8);
  }
  *puVar9 = uVar3;
  poVar1->tileno_size = poVar1->tileno_size + 1;
LAB_001dfc88:
  uVar4 = cio_read(cio,4);
  if (uVar4 == 0) {
    iVar5 = cio_numbytesleft(cio);
    uVar4 = iVar5 + 8;
  }
  uVar6 = cio_read(cio,1);
  uVar7 = cio_read(cio,1);
  if ((int)uVar7 <= (int)uVar6) {
    opj_event_msg(j2k->cinfo,2,
                  "SOT marker inconsistency in tile %d: tile-part index greater (%d) than number of tile-parts (%d)\n"
                  ,(ulong)uVar3,(ulong)uVar6,(ulong)uVar7);
    uVar7 = uVar6 + 1;
  }
  j2k->curtileno = uVar3;
  j2k->cur_tp_num = uVar6;
  puVar10 = cio_getbp(cio);
  j2k->eot = puVar10 + (long)(int)uVar4 + -0xc;
  j2k->state = 0x10;
  __dest = poVar1->tcps + j2k->curtileno;
  poVar13 = j2k->cstr_info;
  if (poVar13 != (opj_codestream_info_t *)0x0) {
    if (__dest->first == 0) {
      poVar14 = poVar13->tile;
      poVar14[(int)uVar3].end_pos = poVar14[(int)uVar3].end_pos + uVar4;
    }
    else {
      if (uVar3 == 0) {
        iVar5 = cio_tell(cio);
        poVar13 = j2k->cstr_info;
        poVar13->main_head_end = iVar5 + -0xd;
      }
      poVar13->tile[(int)uVar3].tileno = uVar3;
      iVar5 = cio_tell(cio);
      poVar14 = j2k->cstr_info->tile;
      poVar14[(int)uVar3].start_pos = iVar5 + -0xc;
      poVar14[(int)uVar3].end_pos = iVar5 + uVar4 + -0xd;
    }
    poVar14[(int)uVar3].num_tps = uVar7;
    if (uVar7 == 0) {
      __size = 200;
    }
    else {
      __size = (long)(int)uVar7 * 0x14;
    }
    poVar11 = (opj_tp_info_t *)realloc(poVar14[(int)uVar3].tp,__size);
    j2k->cstr_info->tile[(int)uVar3].tp = poVar11;
    iVar5 = cio_tell(cio);
    poVar11 = j2k->cstr_info->tile[(int)uVar3].tp;
    poVar11[(int)uVar6].tp_start_pos = iVar5 + -0xc;
    poVar11[(int)uVar6].tp_end_pos = iVar5 + uVar4 + -0xd;
  }
  if (__dest->first == 1) {
    poVar2 = __dest->tccps;
    memcpy(__dest,j2k->default_tcp,0x15e0);
    __dest->ppt = 0;
    __dest->ppt_data = (uchar *)0x0;
    __dest->ppt_data_first = (uchar *)0x0;
    __dest->tccps = poVar2;
    lVar8 = 0;
    for (uVar15 = 0; uVar15 < j2k->image->numcomps; uVar15 = uVar15 + 1) {
      memcpy((void *)((long)__dest->tccps->stepsizes + lVar8 + -0x1c),
             (void *)((long)j2k->default_tcp->tccps->stepsizes + lVar8 + -0x1c),0x438);
      lVar8 = lVar8 + 0x438;
    }
    poVar1->tcps[j2k->curtileno].first = 0;
  }
  return;
}

Assistant:

static void j2k_read_sot(opj_j2k_t *j2k) {
	int len, tileno, totlen, partno, numparts, i;
	opj_tcp_t *tcp = NULL;
	char status = 0;

	opj_cp_t *cp = j2k->cp;
	opj_cio_t *cio = j2k->cio;

	len = cio_read(cio, 2);
	tileno = cio_read(cio, 2);

#ifdef USE_JPWL
	if (j2k->cp->correct) {

		static int backup_tileno = 0;

		/* tileno is negative or larger than the number of tiles!!! */
		if ((tileno < 0) || (tileno > (cp->tw * cp->th))) {
			opj_event_msg(j2k->cinfo, EVT_ERROR,
				"JPWL: bad tile number (%d out of a maximum of %d)\n",
				tileno, (cp->tw * cp->th));
			if (!JPWL_ASSUME) {
				opj_event_msg(j2k->cinfo, EVT_ERROR, "JPWL: giving up\n");
				return;
			}
			/* we try to correct */
			tileno = backup_tileno;
			opj_event_msg(j2k->cinfo, EVT_WARNING, "- trying to adjust this\n"
				"- setting tile number to %d\n",
				tileno);
		}

		/* keep your private count of tiles */
		backup_tileno++;
	};
#endif /* USE_JPWL */
	
	if (cp->tileno_size == 0) {
		cp->tileno[cp->tileno_size] = tileno;
		cp->tileno_size++;
	} else {
		i = 0;
		while (i < cp->tileno_size && status == 0) {
			status = cp->tileno[i] == tileno ? 1 : 0;
			i++;
		}
		if (status == 0) {
			cp->tileno[cp->tileno_size] = tileno;
			cp->tileno_size++;
		}
	}
	
	totlen = cio_read(cio, 4);

#ifdef USE_JPWL
	if (j2k->cp->correct) {

		/* totlen is negative or larger than the bytes left!!! */
		if ((totlen < 0) || (totlen > (cio_numbytesleft(cio) + 8))) {
			opj_event_msg(j2k->cinfo, EVT_ERROR,
				"JPWL: bad tile byte size (%d bytes against %d bytes left)\n",
				totlen, cio_numbytesleft(cio) + 8);
			if (!JPWL_ASSUME) {
				opj_event_msg(j2k->cinfo, EVT_ERROR, "JPWL: giving up\n");
				return;
			}
			/* we try to correct */
			totlen = 0;
			opj_event_msg(j2k->cinfo, EVT_WARNING, "- trying to adjust this\n"
				"- setting Psot to %d => assuming it is the last tile\n",
				totlen);
		}

	};
#endif /* USE_JPWL */

	if (!totlen)
		totlen = cio_numbytesleft(cio) + 8;
	
	partno = cio_read(cio, 1);
	numparts = cio_read(cio, 1);
  
  if (partno >= numparts) {
    opj_event_msg(j2k->cinfo, EVT_WARNING, "SOT marker inconsistency in tile %d: tile-part index greater (%d) than number of tile-parts (%d)\n", tileno, partno, numparts);
    numparts = partno+1;
  }
	
	j2k->curtileno = tileno;
	j2k->cur_tp_num = partno;
	j2k->eot = cio_getbp(cio) - 12 + totlen;
	j2k->state = J2K_STATE_TPH;
	tcp = &cp->tcps[j2k->curtileno];

	/* Index */
	if (j2k->cstr_info) {
		if (tcp->first) {
			if (tileno == 0) 
				j2k->cstr_info->main_head_end = cio_tell(cio) - 13;
			j2k->cstr_info->tile[tileno].tileno = tileno;
			j2k->cstr_info->tile[tileno].start_pos = cio_tell(cio) - 12;
			j2k->cstr_info->tile[tileno].end_pos = j2k->cstr_info->tile[tileno].start_pos + totlen - 1;				
    } else {
			j2k->cstr_info->tile[tileno].end_pos += totlen;
		}
    j2k->cstr_info->tile[tileno].num_tps = numparts;
    if (numparts)
      j2k->cstr_info->tile[tileno].tp = (opj_tp_info_t *) opj_realloc(j2k->cstr_info->tile[tileno].tp, numparts * sizeof(opj_tp_info_t));
    else
      j2k->cstr_info->tile[tileno].tp = (opj_tp_info_t *) opj_realloc(j2k->cstr_info->tile[tileno].tp, 10 * sizeof(opj_tp_info_t)); /* Fixme (10)*/
		j2k->cstr_info->tile[tileno].tp[partno].tp_start_pos = cio_tell(cio) - 12;
		j2k->cstr_info->tile[tileno].tp[partno].tp_end_pos = 
			j2k->cstr_info->tile[tileno].tp[partno].tp_start_pos + totlen - 1;
	}
	
	if (tcp->first == 1) {		
		/* Initialization PPT */
		opj_tccp_t *tmp = tcp->tccps;
		memcpy(tcp, j2k->default_tcp, sizeof(opj_tcp_t));
		tcp->ppt = 0;
		tcp->ppt_data = NULL;
		tcp->ppt_data_first = NULL;
		tcp->tccps = tmp;

		for (i = 0; i < j2k->image->numcomps; i++) {
			tcp->tccps[i] = j2k->default_tcp->tccps[i];
		}
		cp->tcps[j2k->curtileno].first = 0;
	}
}